

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastpfor.h
# Opt level: O0

void __thiscall
FastPForLib::FastPForImpl<8U,_unsigned_int>::__encodeArray
          (FastPForImpl<8U,_unsigned_int> *this,uint *in,size_t length,uint32_t *out,size_t *nvalue)

{
  uint uVar1;
  ulong uVar2;
  reference pvVar3;
  uint *puVar4;
  reference pvVar5;
  size_type sVar6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  reference this_01;
  undefined4 *in_RCX;
  long in_RDX;
  byte *pbVar7;
  uint *puVar8;
  size_t in_RSI;
  size_type in_RDI;
  long *in_R8;
  size_t nValue;
  uint32_t k_3;
  uint32_t k_2;
  uint bitmap;
  uint8_t *pad8;
  uint32_t bytescontainersize;
  uint32_t k_1;
  uint maxval;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *thisexceptioncontainer;
  uint8_t maxb;
  uint8_t bestcexcept;
  uint8_t bestb;
  uint *final;
  uint8_t *bc;
  uint8_t *in_stack_00000078;
  uint32_t k;
  uint32_t *headerout;
  uint32_t *initout;
  undefined4 in_stack_ffffffffffffff48;
  uint32_t in_stack_ffffffffffffff4c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff50;
  uint *source;
  uint local_84;
  uint local_80;
  uint local_7c;
  uint *local_78;
  uint local_68;
  byte local_53;
  byte local_52;
  byte local_51;
  byte *local_48;
  uint local_3c;
  uint *local_20;
  
  checkifdivisibleby(in_RSI,(uint32_t)((ulong)in_RDX >> 0x20));
  local_20 = in_RCX + 1;
  for (local_3c = 0; local_3c < 0x21; local_3c = local_3c + 1) {
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  *)(in_RDI + 8),(ulong)local_3c);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x11d8bb);
  }
  local_48 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x20),0);
  uVar2 = in_RSI + in_RDX * 4;
  for (; in_RSI + 0x400 <= uVar2; in_RSI = in_RSI + 0x400) {
    getBestBFromData((FastPForImpl<8U,_unsigned_int> *)nvalue,initout,(uint8_t *)headerout,
                     in_stack_00000078,bc);
    *local_48 = local_51;
    pbVar7 = local_48 + 2;
    local_48[1] = local_52;
    if (local_52 != 0) {
      local_48 = local_48 + 3;
      *pbVar7 = local_53;
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    *)(in_RDI + 8),(long)(int)((uint)local_53 - (uint)local_51));
      for (local_68 = 0; pbVar7 = local_48, local_68 < 0x100; local_68 = local_68 + 1) {
        if ((uint)(1L << (local_51 & 0x3f)) <= *(uint *)(in_RSI + (ulong)local_68 * 4)) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (in_stack_ffffffffffffff50,
                     (value_type *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
          *local_48 = (byte)local_68;
          local_48 = local_48 + 1;
        }
      }
    }
    local_48 = pbVar7;
    local_20 = packblockup<256u,unsigned_int>
                         ((uint *)in_stack_ffffffffffffff50,
                          (uint32_t *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                          0);
  }
  *in_RCX = (int)((long)local_20 - (long)in_RCX >> 2);
  pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x20),0);
  uVar1 = (int)local_48 - (int)pvVar3;
  puVar8 = local_20 + 1;
  *local_20 = uVar1;
  source = puVar8;
  pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x20),0);
  memcpy(source,pvVar3,(ulong)uVar1);
  puVar4 = (uint *)(((ulong)uVar1 + 3 & 0xfffffffffffffffc) + (long)puVar8);
  local_78 = (uint *)((long)puVar8 + (ulong)uVar1);
  while (local_78 < puVar4) {
    *(undefined1 *)local_78 = 0;
    local_78 = (uint *)((long)local_78 + 1);
  }
  local_7c = 0;
  for (local_80 = 2; local_80 < 0x21; local_80 = local_80 + 1) {
    pvVar5 = std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           *)(in_RDI + 8),(ulong)local_80);
    sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar5);
    if (sVar6 != 0) {
      local_7c = local_7c | (uint)(1L << ((char)local_80 - 1U & 0x3f));
    }
  }
  *puVar4 = local_7c;
  local_20 = puVar4 + 1;
  for (local_84 = 2; local_84 < 0x21; local_84 = local_84 + 1) {
    pvVar5 = std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           *)(in_RDI + 8),(ulong)local_84);
    sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar5);
    if (sVar6 != 0) {
      pvVar5 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             *)(in_RDI + 8),(ulong)local_84);
      this_00 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar5);
      pvVar5 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             *)(in_RDI + 8),(ulong)local_84);
      this_01 = std::
                vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                              *)(in_RDI + 8),(ulong)local_84);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(this_01);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(this_00,in_RDI);
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    *)(in_RDI + 8),(ulong)local_84);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x11dcc9);
      local_20 = packingvector<32U>::packmeuptightwithoutmask<unsigned_int>
                           (source,(size_t)local_48,(uint32_t *)pvVar5,in_stack_ffffffffffffff4c);
    }
  }
  *in_R8 = (long)local_20 - (long)in_RCX >> 2;
  return;
}

Assistant:

void __encodeArray(const IntType *in, const size_t length, uint32_t *out,
                     size_t &nvalue) {
    uint32_t *const initout = out;  // keep track of this
    checkifdivisibleby(length, BlockSize);
    uint32_t *const headerout = out++;  // keep track of this
    for (uint32_t k = 0; k < sizeof(IntType) * 8 + 1; ++k) {
      datatobepacked[k].clear();
    }
    uint8_t *bc = &bytescontainer[0];
    for (const IntType *const final = in + length; (in + BlockSize <= final);
         in += BlockSize) {
      uint8_t bestb, bestcexcept, maxb;
      getBestBFromData(in, bestb, bestcexcept, maxb);
      *bc++ = bestb;
      *bc++ = bestcexcept;
      if (bestcexcept > 0) {
        *bc++ = maxb;
        std::vector<IntType> &thisexceptioncontainer =
            datatobepacked[maxb - bestb];
        const IntType maxval = static_cast<IntType>(1ULL << bestb);
        for (uint32_t k = 0; k < BlockSize; ++k) {
          if (in[k] >= maxval) {
            // we have an exception
            thisexceptioncontainer.push_back(in[k] >> bestb);
            *bc++ = static_cast<uint8_t>(k);
          }
        }
      }
      out = packblockup<BlockSize>(in, out, bestb);
    }
    headerout[0] = static_cast<uint32_t>(out - headerout);
    const uint32_t bytescontainersize =
        static_cast<uint32_t>(bc - &bytescontainer[0]);
    *(out++) = bytescontainersize;
    memcpy(out, &bytescontainer[0], bytescontainersize);
    uint8_t* pad8 = (uint8_t*)out + bytescontainersize;
    out += (bytescontainersize + sizeof(uint32_t) - 1) / sizeof(uint32_t);
    while (pad8 < (uint8_t*)out)
        *pad8++ = 0; // clear padding bytes

    IntType bitmap = 0;
    for (uint32_t k = 2; k <= sizeof(IntType) * 8; ++k) {
      if (datatobepacked[k].size() != 0) bitmap |= (1ULL << (k - 1));
    }
    *(reinterpret_cast<IntType *>(out)) = bitmap;
    out += (sizeof(IntType) + sizeof(uint32_t) - 1) / sizeof(uint32_t);

    for (uint32_t k = 2; k <= sizeof(IntType) * 8; ++k) {
      if (datatobepacked[k].size() > 0) {
        size_t nValue = datatobepacked[k].size();
        datatobepacked[k].resize((datatobepacked[k].size() + 32 - 1) / 32 * 32);
        out = packingvector<32>::packmeuptightwithoutmask(
            datatobepacked[k].data(), nValue, out, k);
      }
    }
    nvalue = out - initout;
  }